

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall TPZSkylMatrix<double>::Subst_Diag(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  long lVar1;
  double **ppdVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar6;
  
  lVar6 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar5 = 0;
  if ((lVar6 == CONCAT44(extraout_var,iVar4)) &&
     (iVar5 = 0, (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed == '\x04')) {
    iVar5 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    lVar6 = CONCAT44(extraout_var_00,iVar5);
    iVar5 = 1;
    if ((lVar6 != 0) && (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      lVar1 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar10 = 0;
      lVar9 = 0;
      do {
        if (lVar1 < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar6 != 0 && -1 < extraout_var_00) {
          ppdVar2 = (this->fElem).fStore;
          lVar7 = lVar1 * lVar10;
          pdVar3 = B->fElem;
          lVar8 = 0;
          do {
            *(double *)((long)pdVar3 + lVar8 * 8 + lVar7) =
                 *(double *)((long)pdVar3 + lVar8 * 8 + lVar7) / *ppdVar2[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar6 != lVar8);
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 8;
      } while (lVar9 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
    }
  }
  return iVar5;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ELDLt) return( 0 );
    int64_t dimension = this->Dim();
    if (!dimension) {
        return 1;
    }
    for ( int64_t j = 0; j < B->Cols(); j++ ) {
        TVar *BPtr = &(*B)(0,j);
        int64_t k=0;
        while(k < dimension) *BPtr++ /= *(fElem[k++]);
    }
    return( 1 );
}